

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autotune.cc
# Opt level: O0

int __thiscall
fasttext::Autotune::getCutoffForFileSize
          (Autotune *this,bool qout,bool qnorm,int dsub,int64_t fileSize)

{
  int64_t iVar1;
  FastText *this_00;
  int *piVar2;
  int in_ECX;
  byte in_DL;
  byte in_SIL;
  int in_R8D;
  int cutoff;
  int target;
  int64_t dim;
  int64_t outputPqSize;
  int64_t outN;
  int64_t outM;
  int64_t outModelSize;
  int64_t in_stack_ffffffffffffff20;
  Matrix *in_stack_ffffffffffffff28;
  Matrix *this_01;
  long local_c8;
  FastText *in_stack_ffffffffffffff58;
  int local_88;
  int local_84;
  Matrix local_80;
  long local_68;
  FastText *local_50;
  int64_t local_28;
  long local_20;
  int local_18;
  int local_10;
  byte local_a;
  byte local_9;
  
  local_9 = in_SIL & 1;
  local_a = in_DL & 1;
  local_20 = 0;
  local_10 = in_ECX;
  local_18 = in_R8D;
  std::__shared_ptr_access<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1784a4);
  FastText::getOutputMatrix(in_stack_ffffffffffffff58);
  std::__shared_ptr_access<const_fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<const_fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x1784c3);
  iVar1 = Matrix::size(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  std::shared_ptr<const_fasttext::DenseMatrix>::~shared_ptr
            ((shared_ptr<const_fasttext::DenseMatrix> *)0x1784e3);
  local_28 = iVar1;
  std::__shared_ptr_access<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1784fa);
  FastText::getOutputMatrix(in_stack_ffffffffffffff58);
  std::__shared_ptr_access<const_fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<const_fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x178519);
  this_00 = (FastText *)Matrix::size(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  std::shared_ptr<const_fasttext::DenseMatrix>::~shared_ptr
            ((shared_ptr<const_fasttext::DenseMatrix> *)0x17853a);
  if ((local_9 & 1) == 0) {
    local_20 = local_28 * (long)this_00 * 4 + 0x10;
  }
  else {
    local_68 = (long)this_00 * 0x400 + 0x10;
    if ((local_a & 1) == 0) {
      local_c8 = 0;
    }
    else {
      local_c8 = local_28;
    }
    local_20 = local_28 *
               ((long)((long)&(this_00->args_).
                              super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                      + 1) / 2) + 0x15 + local_68 + local_c8;
  }
  local_50 = this_00;
  std::__shared_ptr_access<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x178665);
  this_01 = &local_80;
  FastText::getInputMatrix(this_00);
  std::__shared_ptr_access<const_fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<const_fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x178681);
  iVar1 = Matrix::size(this_01,in_stack_ffffffffffffff20);
  std::shared_ptr<const_fasttext::DenseMatrix>::~shared_ptr
            ((shared_ptr<const_fasttext::DenseMatrix> *)0x17869f);
  local_84 = ((local_18 + -0x6b) - (int)(iVar1 << 10)) - (int)local_20;
  local_88 = (int)((long)local_84 /
                  ((iVar1 + local_10 + -1) / (long)local_10 + (long)(int)(uint)((local_a & 1) != 0)
                  + 10));
  local_80.n_ = iVar1;
  piVar2 = std::max<int>(&local_88,&kCutoffLimit);
  return *piVar2;
}

Assistant:

int Autotune::getCutoffForFileSize(
    bool qout,
    bool qnorm,
    int dsub,
    int64_t fileSize) const {
  int64_t outModelSize = 0;
  const int64_t outM = fastText_->getOutputMatrix()->size(0);
  const int64_t outN = fastText_->getOutputMatrix()->size(1);
  if (qout) {
    const int64_t outputPqSize = 16 + 4 * (outN * (1 << 8));
    outModelSize =
        21 + (outM * ((outN + 2 - 1) / 2)) + outputPqSize + (qnorm ? outM : 0);
  } else {
    outModelSize = 16 + 4 * (outM * outN);
  }
  const int64_t dim = fastText_->getInputMatrix()->size(1);

  int target = (fileSize - (107) - 4 * (1 << 8) * dim - outModelSize);
  int cutoff = target / ((dim + dsub - 1) / dsub + (qnorm ? 1 : 0) + 10);

  return std::max(cutoff, kCutoffLimit);
}